

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

void __thiscall
helics::TimeCoordinator::sendTimeRequest(TimeCoordinator *this,GlobalFederateId triggerFed)

{
  Time val;
  Time val_00;
  Time val_01;
  Time val_02;
  Time val_03;
  Time val_04;
  bool bVar1;
  TimeRepresentation<count_time<9,_long>_> *pTVar2;
  BaseType in_ESI;
  long in_RDI;
  DependencyInfo *dep;
  pair<bool,_bool> check;
  ActionMessage upd;
  undefined4 in_stack_fffffffffffffdc8;
  int32_t in_stack_fffffffffffffdcc;
  Time in_stack_fffffffffffffdd0;
  undefined7 in_stack_fffffffffffffdd8;
  undefined1 in_stack_fffffffffffffddf;
  undefined8 in_stack_fffffffffffffde8;
  ActionMessage *in_stack_fffffffffffffdf0;
  TimeCoordinator *in_stack_fffffffffffffdf8;
  TimeDependencies *in_stack_fffffffffffffe00;
  undefined8 in_stack_fffffffffffffe08;
  GlobalFederateId *this_00;
  GlobalFederateId gid;
  GlobalFederateId local_144;
  undefined4 local_140;
  pair<bool,_bool> local_13a;
  undefined8 local_138;
  undefined8 local_130;
  baseType local_128;
  undefined8 local_120;
  undefined8 local_118;
  baseType local_110;
  undefined8 local_108;
  undefined8 local_100;
  baseType local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  baseType local_e0;
  ActionMessage local_c8;
  GlobalFederateId local_4;
  
  gid.gid = (BaseType)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  local_4.gid = in_ESI;
  ActionMessage::ActionMessage
            (in_stack_fffffffffffffdf0,(action_t)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  local_c8.source_id.gid = *(BaseType *)(in_RDI + 0x48);
  local_c8.actionTime.internalTimeCode = *(baseType *)(in_RDI + 0x140);
  local_c8.counter = (uint16_t)*(undefined4 *)(in_RDI + 0x4c);
  if ((*(byte *)(in_RDI + 0x55) & 1) != 0) {
    setActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_c8,non_granting_flag);
  }
  if ((*(byte *)(in_RDI + 0x250) & 1) == 0) {
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>
                      ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x138),
                       (TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x140));
    if (bVar1) {
      setActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_c8,interrupted_flag);
    }
  }
  else {
    setActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_c8,delayed_timing_flag);
  }
  local_e8 = *(undefined8 *)(in_RDI + 0x160);
  local_f0 = *(undefined8 *)(in_RDI + 0x238);
  val.internalTimeCode._7_1_ = in_stack_fffffffffffffddf;
  val.internalTimeCode._0_7_ = in_stack_fffffffffffffdd8;
  local_e0 = (baseType)checkAdd(val,in_stack_fffffffffffffdd0);
  local_c8.Te = (Time)local_e0;
  if (((*(byte *)(in_RDI + 0x25e) & 1) == 0) &&
     (((*(byte *)(in_RDI + 0x253) & 1) != 0 ||
      (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=
                         ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x138),
                          (TimeRepresentation<count_time<9,_long>_> *)&cBigTime), bVar1)))) {
    local_100 = *(undefined8 *)(in_RDI + 0x60);
    local_108 = *(undefined8 *)(in_RDI + 0x238);
    val_00.internalTimeCode._7_1_ = in_stack_fffffffffffffddf;
    val_00.internalTimeCode._0_7_ = in_stack_fffffffffffffdd8;
    local_f8 = (baseType)checkAdd(val_00,in_stack_fffffffffffffdd0);
    pTVar2 = std::min<TimeRepresentation<count_time<9,long>>>
                       ((TimeRepresentation<count_time<9,_long>_> *)
                        CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                        (TimeRepresentation<count_time<9,_long>_> *)0x62866f);
    local_c8.Te.internalTimeCode = pTVar2->internalTimeCode;
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      (&local_c8.Te,(TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
    if (bVar1) {
      local_c8.Te.internalTimeCode = 0;
    }
    pTVar2 = std::min<TimeRepresentation<count_time<9,long>>>
                       ((TimeRepresentation<count_time<9,_long>_> *)
                        CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                        (TimeRepresentation<count_time<9,_long>_> *)0x6286ce);
    local_c8.actionTime.internalTimeCode = pTVar2->internalTimeCode;
  }
  local_118 = *(undefined8 *)(in_RDI + 0x60);
  local_120 = *(undefined8 *)(in_RDI + 0x238);
  val_01.internalTimeCode._7_1_ = in_stack_fffffffffffffddf;
  val_01.internalTimeCode._0_7_ = in_stack_fffffffffffffdd8;
  local_110 = (baseType)checkAdd(val_01,in_stack_fffffffffffffdd0);
  pTVar2 = std::min<TimeRepresentation<count_time<9,long>>>
                     ((TimeRepresentation<count_time<9,_long>_> *)
                      CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                      (TimeRepresentation<count_time<9,_long>_> *)0x62874c);
  local_c8.Tdemin.internalTimeCode = pTVar2->internalTimeCode;
  if (((*(byte *)(in_RDI + 0x25e) & 1) == 0) &&
     (((*(byte *)(in_RDI + 0x253) & 1) != 0 ||
      (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=
                         ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x138),
                          (TimeRepresentation<count_time<9,_long>_> *)&cBigTime), bVar1)))) {
    local_130 = *(undefined8 *)(in_RDI + 0x68);
    local_138 = *(undefined8 *)(in_RDI + 0x238);
    val_02.internalTimeCode._7_1_ = in_stack_fffffffffffffddf;
    val_02.internalTimeCode._0_7_ = in_stack_fffffffffffffdd8;
    local_128 = (baseType)checkAdd(val_02,in_stack_fffffffffffffdd0);
    pTVar2 = std::min<TimeRepresentation<count_time<9,long>>>
                       ((TimeRepresentation<count_time<9,_long>_> *)
                        CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                        (TimeRepresentation<count_time<9,_long>_> *)0x628818);
    local_c8.Tdemin.internalTimeCode = pTVar2->internalTimeCode;
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      (&local_c8.Tdemin,
                       (TimeRepresentation<count_time<9,_long>_> *)&helics::timeZero);
    if (bVar1) {
      local_c8.Tdemin.internalTimeCode = 0;
    }
    bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<
                      (&local_c8.Tdemin,&local_c8.actionTime);
    if (bVar1) {
      local_c8.actionTime.internalTimeCode = local_c8.Tdemin.internalTimeCode;
    }
  }
  GlobalFederateId::baseValue((GlobalFederateId *)(in_RDI + 0x80));
  ActionMessage::setExtraData
            ((ActionMessage *)in_stack_fffffffffffffdd0.internalTimeCode,in_stack_fffffffffffffdcc);
  bVar1 = TimeRepresentation<count_time<9,_long>_>::operator<(&local_c8.Tdemin,&local_c8.actionTime)
  ;
  if (bVar1) {
    local_c8.Tdemin.internalTimeCode = local_c8.actionTime.internalTimeCode;
  }
  if (*(char *)(in_RDI + 0x259) != '\0') {
    setIterationFlags((ActionMessage *)in_stack_fffffffffffffdd0.internalTimeCode,
                      (IterationRequest)((uint)in_stack_fffffffffffffdcc >> 0x18));
  }
  local_c8.counter = (uint16_t)*(undefined4 *)(in_RDI + 0x4c);
  if ((*(byte *)(in_RDI + 0x25d) & 1) != 0) {
    setActionFlag<helics::ActionMessage,helics::InterfaceFlags>(&local_c8,destination_target);
  }
  local_140 = *(undefined4 *)(in_RDI + 0x80);
  local_13a = checkAndSendTimeRequest
                        (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                         (GlobalFederateId)(BaseType)in_stack_fffffffffffffe00);
  if (((ushort)local_13a & 1) == 0) {
    bVar1 = GlobalFederateId::isValid(&local_4);
    if (bVar1) {
      local_c8.dest_id.gid = local_4.gid;
      in_stack_fffffffffffffdd0.internalTimeCode =
           (baseType)TimeDependencies::getDependencyInfo(in_stack_fffffffffffffe00,gid);
      if (((((ActionMessage *)in_stack_fffffffffffffdd0.internalTimeCode)->payload).buffer._M_elems
           [0xe] & 1) != 0) {
        ActionMessage::setExtraDestData
                  ((ActionMessage *)in_stack_fffffffffffffdd0.internalTimeCode,
                   in_stack_fffffffffffffdcc);
        std::function<void_(const_helics::ActionMessage_&)>::operator()
                  ((function<void_(const_helics::ActionMessage_&)> *)
                   in_stack_fffffffffffffdd0.internalTimeCode,
                   (ActionMessage *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
      }
    }
  }
  else if ((((ushort)local_13a & 0x100) != 0) &&
          (bVar1 = GlobalFederateId::isValid((GlobalFederateId *)(in_RDI + 0x80)), bVar1)) {
    local_c8.dest_id.gid = *(BaseType *)(in_RDI + 0x80);
    local_144.gid = 0;
    this_00 = &local_144;
    GlobalFederateId::GlobalFederateId(this_00);
    GlobalFederateId::baseValue(this_00);
    ActionMessage::setExtraData
              ((ActionMessage *)in_stack_fffffffffffffdd0.internalTimeCode,in_stack_fffffffffffffdcc
              );
    ActionMessage::setExtraDestData
              ((ActionMessage *)in_stack_fffffffffffffdd0.internalTimeCode,in_stack_fffffffffffffdcc
              );
    if (((*(byte *)(in_RDI + 0x25e) & 1) == 0) &&
       (((*(byte *)(in_RDI + 0x253) & 1) != 0 ||
        (bVar1 = TimeRepresentation<count_time<9,_long>_>::operator>=
                           ((TimeRepresentation<count_time<9,_long>_> *)(in_RDI + 0x138),
                            (TimeRepresentation<count_time<9,_long>_> *)&cBigTime), bVar1)))) {
      val_03.internalTimeCode._7_1_ = in_stack_fffffffffffffddf;
      val_03.internalTimeCode._0_7_ = in_stack_fffffffffffffdd8;
      local_c8.Te = checkAdd(val_03,in_stack_fffffffffffffdd0);
      val_04.internalTimeCode._7_1_ = in_stack_fffffffffffffddf;
      val_04.internalTimeCode._0_7_ = in_stack_fffffffffffffdd8;
      checkAdd(val_04,in_stack_fffffffffffffdd0);
      pTVar2 = std::min<TimeRepresentation<count_time<9,long>>>
                         ((TimeRepresentation<count_time<9,_long>_> *)
                          CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                          (TimeRepresentation<count_time<9,_long>_> *)0x628b54);
      local_c8.Te.internalTimeCode = pTVar2->internalTimeCode;
    }
    pTVar2 = std::min<TimeRepresentation<count_time<9,long>>>
                       ((TimeRepresentation<count_time<9,_long>_> *)
                        CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8),
                        (TimeRepresentation<count_time<9,_long>_> *)0x628b84);
    local_c8.Tdemin.internalTimeCode = pTVar2->internalTimeCode;
    std::function<void_(const_helics::ActionMessage_&)>::operator()
              ((function<void_(const_helics::ActionMessage_&)> *)
               in_stack_fffffffffffffdd0.internalTimeCode,
               (ActionMessage *)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  }
  ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffdd0.internalTimeCode);
  return;
}

Assistant:

void TimeCoordinator::sendTimeRequest(GlobalFederateId triggerFed) const
{
    ActionMessage upd(CMD_TIME_REQUEST);
    upd.source_id = mSourceId;
    upd.actionTime = time_next;
    upd.counter = sequenceCounter;
    if (nonGranting) {
        setActionFlag(upd, non_granting_flag);
    }
    if (info.wait_for_current_time_updates) {
        setActionFlag(upd, delayed_timing_flag);
    } else if (time_requested > time_next) {
        setActionFlag(upd, interrupted_flag);
    }
    upd.Te = checkAdd(time_exec, info.outputDelay);
    if (!globalTime && (info.event_triggered || time_requested >= cBigTime)) {
        upd.Te = std::min(upd.Te, checkAdd(upstream.Te, info.outputDelay));
        if (upd.Te < timeZero) {
            upd.Te = timeZero;
        }
        upd.actionTime = std::min(upd.actionTime, upd.Te);
    }
    upd.Tdemin = std::min(checkAdd(upstream.Te, info.outputDelay), upd.Te);
    if (!globalTime && (info.event_triggered || time_requested >= cBigTime)) {
        upd.Tdemin = std::min(upd.Tdemin, checkAdd(upstream.minDe, info.outputDelay));
        if (upd.Tdemin < timeZero) {
            upd.Tdemin = timeZero;
        }
        if (upd.Tdemin < upd.actionTime) {
            upd.actionTime = upd.Tdemin;
        }
    }
    upd.setExtraData(upstream.minFed.baseValue());

    if (upd.Tdemin < upd.actionTime) {
        upd.Tdemin = upd.actionTime;
    }

    if (iterating != IterationRequest::NO_ITERATIONS) {
        setIterationFlags(upd, iterating);
    }
    upd.counter = sequenceCounter;
    if (triggered) {
        setActionFlag(upd, destination_target);
    }
    auto check = checkAndSendTimeRequest(upd, upstream.minFed);
    if (check.first) {
        if (check.second) {
            if (upstream.minFed.isValid()) {
                upd.dest_id = upstream.minFed;
                upd.setExtraData(GlobalFederateId{}.baseValue());
                upd.setExtraDestData(upstream.responseSequenceCounter);
                if (!globalTime && (info.event_triggered || time_requested >= cBigTime)) {
                    upd.Te = checkAdd(time_exec, info.outputDelay);
                    upd.Te = std::min(upd.Te, checkAdd(upstream.TeAlt, info.outputDelay));
                }
                upd.Tdemin = std::min(upstream.TeAlt, upd.Te);
                sendMessageFunction(upd);
            }
        }
    } else if (triggerFed.isValid()) {
        upd.dest_id = triggerFed;
        const auto* dep = dependencies.getDependencyInfo(triggerFed);
        if (dep->dependent) {
            upd.setExtraDestData(dep->sequenceCounter);
            sendMessageFunction(upd);
        }
    }

    //    printf("%d next=%f, exec=%f, Tdemin=%f\n", mSourceId, static_cast<double>(time_next),
    // static_cast<double>(time_exec), static_cast<double>(time_minDe));
}